

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

float norm(float *v,int n)

{
  double dVar1;
  float local_1c;
  int local_18;
  float sum;
  int i;
  int n_local;
  float *v_local;
  
  local_1c = 0.0;
  for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
    local_1c = v[local_18] * v[local_18] + local_1c;
  }
  dVar1 = sqrt((double)local_1c);
  return (float)dVar1;
}

Assistant:

float norm(float v[],int n)
{
int i;
float sum = 0.0;

for (i=0;i<n; i++)
        sum += (v[i]*v[i]);
sum = (float) sqrt(sum);
return sum;
}